

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QRect __thiscall
QStyleSheetStyle::positionRect
          (QStyleSheetStyle *this,QWidget *w,QRenderRule *rule2,int pe,QRect *originRect,
          LayoutDirection dir)

{
  QStyleSheetPositionData *pQVar1;
  QStyleSheetGeometryData *pQVar2;
  int *piVar3;
  bool bVar4;
  PositionMode PVar5;
  int iVar6;
  undefined8 uVar7;
  QSize QVar8;
  QSize QVar9;
  int iVar10;
  undefined8 uVar11;
  ulong uVar12;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  int iVar13;
  int *piVar14;
  QSize QVar15;
  long in_FS_OFFSET;
  QSize sz;
  QSize local_60;
  QRect local_58;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (rule2->p).d.ptr;
  if (((pQVar1 == (QStyleSheetPositionData *)0x0) ||
      (PVar5 = pQVar1->mode, PVar5 == PositionMode_Unknown)) &&
     ((0x36 < (uint)pe ||
      (PVar5 = PositionMode_Absolute, (0x4600000fe00000U >> ((ulong)(uint)pe & 0x3f) & 1) == 0)))) {
    PVar5 = PositionMode_Static;
  }
  if ((pQVar1 == (QStyleSheetPositionData *)0x0) ||
     (alignment.i = (pQVar1->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                    super_QFlagsStorage<Qt::AlignmentFlag>.i, alignment.i == 0)) {
    alignment.i = 0;
    if (pe - 1U < 0x3c) {
      alignment.i = *(Int *)(&DAT_0067fef8 + (ulong)(pe - 1U) * 4);
    }
  }
  local_58 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  if (PVar5 == PositionMode_Absolute) {
    if (pQVar1 == (QStyleSheetPositionData *)0x0) {
      uVar7._0_4_ = originRect->x1;
      uVar7._4_4_ = originRect->y1;
      uVar11._0_4_ = originRect->x2;
      uVar11._4_4_ = originRect->y2;
    }
    else {
      piVar14 = &pQVar1->left;
      piVar3 = &pQVar1->right;
      if (dir == LeftToRight) {
        piVar14 = &pQVar1->right;
        piVar3 = &pQVar1->left;
      }
      uVar7 = CONCAT44((originRect->y1).m_i + pQVar1->top,(originRect->x1).m_i + *piVar3);
      uVar11 = CONCAT44((originRect->y2).m_i - pQVar1->bottom,(originRect->x2).m_i - *piVar14);
    }
    local_58.x2.m_i = (int)uVar11;
    local_58.y2.m_i = (int)((ulong)uVar11 >> 0x20);
    local_58.x1.m_i = (int)uVar7;
    local_58.y1.m_i = (int)((ulong)uVar7 >> 0x20);
    bVar4 = QRenderRule::hasContentsSize(rule2);
    if (bVar4) {
      local_60 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = QRenderRule::contentsSize(rule2);
      QVar8 = QRenderRule::boxSize(rule2,&local_40,7);
      pQVar2 = (rule2->geo).d.ptr;
      if (pQVar2 == (QStyleSheetGeometryData *)0x0) {
        QVar15.wd.m_i = 0;
        QVar15.ht.m_i = 0;
      }
      else {
        QVar15.wd.m_i = pQVar2->minWidth;
        QVar15.ht.m_i = pQVar2->minHeight;
      }
      QVar9 = QVar15;
      if (QVar15.wd.m_i.m_i < QVar8.wd.m_i.m_i) {
        QVar9 = QVar8;
      }
      if (QVar15.ht.m_i.m_i < QVar8.ht.m_i.m_i) {
        QVar15 = QVar8;
      }
      local_60 = (QSize)(((ulong)QVar9 & 0xffffffff) + ((ulong)QVar15 & 0xffffffff00000000));
      if (QVar9.wd.m_i.m_i == -1) {
        local_60.wd.m_i = (local_58.x2.m_i - local_58.x1.m_i) + 1;
      }
      if (local_60.ht.m_i == -1) {
        local_60.ht.m_i = (local_58.y2.m_i - local_58.y1.m_i) + 1;
      }
      local_58 = QStyle::alignedRect(dir,(Alignment)alignment.i,&local_60,&local_58);
    }
  }
  else {
    local_60 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = QRenderRule::contentsSize(rule2);
    QVar8 = QRenderRule::boxSize(rule2,&local_40,7);
    QVar8 = defaultSize(this,w,QVar8,originRect,pe);
    pQVar2 = (rule2->geo).d.ptr;
    if (pQVar2 == (QStyleSheetGeometryData *)0x0) {
      QVar9.wd.m_i = 0;
      QVar9.ht.m_i = 0;
    }
    else {
      QVar9.wd.m_i = pQVar2->minWidth;
      QVar9.ht.m_i = pQVar2->minHeight;
    }
    uVar12 = (ulong)QVar9 >> 0x20;
    local_60.wd = QVar8.wd.m_i;
    QVar15 = QVar8;
    if (local_60.wd.m_i <= QVar9.wd.m_i.m_i) {
      QVar15 = QVar9;
    }
    local_60.ht = QVar8.ht.m_i;
    if (QVar9.ht.m_i.m_i < local_60.ht.m_i) {
      uVar12 = (ulong)(uint)local_60.ht.m_i;
    }
    local_60 = (QSize)((ulong)QVar15 & 0xffffffff | uVar12 << 0x20);
    local_58 = QStyle::alignedRect(dir,(Alignment)alignment.i,&local_60,originRect);
    if (pQVar1 != (QStyleSheetPositionData *)0x0) {
      iVar6 = pQVar1->left;
      if (iVar6 == 0) {
        iVar6 = -pQVar1->right;
      }
      iVar10 = pQVar1->top;
      if (iVar10 == 0) {
        iVar10 = -pQVar1->bottom;
      }
      iVar13 = -iVar6;
      if (dir == LeftToRight) {
        iVar13 = iVar6;
      }
      local_58.y1.m_i = iVar10 + local_58.y1.m_i;
      local_58.x1.m_i = iVar13 + local_58.x1.m_i;
      local_58.x2.m_i = iVar13 + local_58.x2.m_i;
      local_58.y2.m_i = iVar10 + local_58.y2.m_i;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

QRect QStyleSheetStyle::positionRect(const QWidget *w, const QRenderRule &rule2, int pe,
                                     const QRect &originRect, Qt::LayoutDirection dir) const
{
    const QStyleSheetPositionData *p = rule2.position();
    PositionMode mode = (p && p->mode != PositionMode_Unknown) ? p->mode : defaultPositionMode(pe);
    Qt::Alignment position = (p && p->position != 0) ? p->position : defaultPosition(pe);
    QRect r;

    if (mode != PositionMode_Absolute) {
        QSize sz = defaultSize(w, rule2.size(), originRect, pe);
        sz = sz.expandedTo(rule2.minimumContentsSize());
        r = QStyle::alignedRect(dir, position, sz, originRect);
        if (p) {
            int left = p->left ? p->left : -p->right;
            int top = p->top ? p->top : -p->bottom;
            r.translate(dir == Qt::LeftToRight ? left : -left, top);
        }
    } else {
        r = p ? originRect.adjusted(dir == Qt::LeftToRight ? p->left : p->right, p->top,
                                   dir == Qt::LeftToRight ? -p->right : -p->left, -p->bottom)
              : originRect;
        if (rule2.hasContentsSize()) {
            QSize sz = rule2.size().expandedTo(rule2.minimumContentsSize());
            if (sz.width() == -1) sz.setWidth(r.width());
            if (sz.height() == -1) sz.setHeight(r.height());
            r = QStyle::alignedRect(dir, position, sz, r);
        }
    }
    return r;
}